

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O0

void fiat_id_tc26_gost_3410_2012_256_paramSetA_to_bytes(uint8_t *out1,uint64_t *arg1)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint64_t *in_RSI;
  undefined1 *in_RDI;
  uint8_t x91;
  uint8_t x90;
  uint64_t x89;
  uint8_t x88;
  uint64_t x87;
  uint8_t x86;
  uint64_t x85;
  uint8_t x84;
  uint64_t x83;
  uint8_t x82;
  uint64_t x81;
  uint8_t x80;
  uint64_t x79;
  uint8_t x78;
  uint8_t x77;
  uint64_t x76;
  uint8_t x75;
  uint64_t x74;
  uint8_t x73;
  uint64_t x72;
  uint8_t x71;
  uint64_t x70;
  uint8_t x69;
  uint64_t x68;
  uint8_t x67;
  uint64_t x66;
  uint8_t x65;
  uint8_t x64;
  uint64_t x63;
  uint8_t x62;
  uint64_t x61;
  uint8_t x60;
  uint64_t x59;
  uint8_t x58;
  uint64_t x57;
  uint8_t x56;
  uint64_t x55;
  uint8_t x54;
  uint64_t x53;
  uint8_t x52;
  uint64_t x51;
  uint8_t x50;
  uint8_t x49;
  uint64_t x48;
  uint8_t x47;
  uint64_t x46;
  uint8_t x45;
  uint64_t x44;
  uint8_t x43;
  uint64_t x42;
  uint8_t x41;
  uint64_t x40;
  uint8_t x39;
  uint64_t x38;
  uint8_t x37;
  uint8_t x36;
  uint64_t x35;
  uint8_t x34;
  uint64_t x33;
  uint8_t x32;
  uint64_t x31;
  uint8_t x30;
  uint64_t x29;
  uint8_t x28;
  uint64_t x27;
  uint8_t x26;
  uint64_t x25;
  uint64_t x24;
  uint64_t x23;
  uint64_t x22;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x21;
  uint64_t x20;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x19;
  uint64_t x18;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x17;
  uint64_t x16;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x15;
  uint64_t x14;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x13;
  uint64_t x12;
  uint64_t x11;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x10;
  uint64_t x9;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x8;
  uint64_t x7;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x6;
  uint64_t x5;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x4;
  uint64_t x3;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x2;
  uint64_t x1;
  uint64_t in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  undefined8 in_stack_fffffffffffffd68;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 arg1_00;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 local_b1;
  uint64_t local_b0;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 local_a1;
  uint64_t local_a0;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 local_91;
  uint64_t local_90;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 local_81;
  uint64_t local_80;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 local_71;
  ulong local_70;
  ulong local_68;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 local_59;
  uint64_t local_58;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 local_49;
  uint64_t local_48;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 local_39;
  uint64_t local_38;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 local_29;
  uint64_t local_28;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 local_19;
  uint64_t local_18;
  uint64_t *local_10;
  undefined1 *local_8;
  
  arg1_00 = (fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1)
            ((ulong)in_stack_fffffffffffffd68 >> 0x38);
  local_10 = in_RSI;
  local_8 = in_RDI;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_subborrowx_u52
            (&local_18,&local_19,'\0',*in_RSI,0xffffffffffd97);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_subborrowx_u51
            (&local_28,&local_29,local_19,local_10[1],0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_subborrowx_u51
            (&local_38,&local_39,local_29,local_10[2],0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_subborrowx_u51
            (&local_48,&local_49,local_39,local_10[3],0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_subborrowx_u51
            (&local_58,&local_59,local_49,local_10[4],0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),arg1_00,
             CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
            );
  fiat_id_tc26_gost_3410_2012_256_paramSetA_addcarryx_u52
            (&local_70,&local_71,'\0',local_18,local_68 & 0xffffffffffd97);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_addcarryx_u51
            (&local_80,&local_81,local_71,local_28,local_68 & 0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_addcarryx_u51
            (&local_90,&local_91,local_81,local_38,local_68 & 0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_addcarryx_u51
            (&local_a0,&local_a1,local_91,local_48,local_68 & 0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_addcarryx_u51
            (&local_b0,&local_b1,local_a1,local_58,local_68 & 0x7ffffffffffff);
  uVar1 = local_80 * 0x10 + (local_70 >> 0x30 & 0xff);
  uVar2 = local_90 * 0x80 + (uVar1 >> 0x30 & 0xff);
  uVar3 = local_a0 * 4 + (uVar2 >> 0x38);
  lVar4 = local_b0 * 0x20 + (uVar3 >> 0x30 & 0xff);
  *local_8 = (char)local_70;
  local_8[1] = (char)(local_70 >> 8);
  local_8[2] = (char)(local_70 >> 0x10);
  local_8[3] = (char)(local_70 >> 0x18);
  local_8[4] = (char)(local_70 >> 0x20);
  local_8[5] = (char)(local_70 >> 0x28);
  local_8[6] = (char)uVar1;
  local_8[7] = (char)(uVar1 >> 8);
  local_8[8] = (char)(uVar1 >> 0x10);
  local_8[9] = (char)(uVar1 >> 0x18);
  local_8[10] = (char)(uVar1 >> 0x20);
  local_8[0xb] = (char)(uVar1 >> 0x28);
  local_8[0xc] = (char)uVar2;
  local_8[0xd] = (char)(uVar2 >> 8);
  local_8[0xe] = (char)(uVar2 >> 0x10);
  local_8[0xf] = (char)(uVar2 >> 0x18);
  local_8[0x10] = (char)(uVar2 >> 0x20);
  local_8[0x11] = (char)(uVar2 >> 0x28);
  local_8[0x12] = (char)(uVar2 >> 0x30);
  local_8[0x13] = (char)uVar3;
  local_8[0x14] = (char)(uVar3 >> 8);
  local_8[0x15] = (char)(uVar3 >> 0x10);
  local_8[0x16] = (char)(uVar3 >> 0x18);
  local_8[0x17] = (char)(uVar3 >> 0x20);
  local_8[0x18] = (char)(uVar3 >> 0x28);
  local_8[0x19] = (char)lVar4;
  local_8[0x1a] = (char)((ulong)lVar4 >> 8);
  local_8[0x1b] = (char)((ulong)lVar4 >> 0x10);
  local_8[0x1c] = (char)((ulong)lVar4 >> 0x18);
  local_8[0x1d] = (char)((ulong)lVar4 >> 0x20);
  local_8[0x1e] = (char)((ulong)lVar4 >> 0x28);
  local_8[0x1f] = (char)((ulong)lVar4 >> 0x30);
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_256_paramSetA_to_bytes(
    uint8_t out1[32], const uint64_t arg1[5]) {
    uint64_t x1;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x2;
    uint64_t x3;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x4;
    uint64_t x5;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x6;
    uint64_t x7;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x8;
    uint64_t x9;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x10;
    uint64_t x11;
    uint64_t x12;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x13;
    uint64_t x14;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x15;
    uint64_t x16;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x17;
    uint64_t x18;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x19;
    uint64_t x20;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x21;
    uint64_t x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    uint8_t x26;
    uint64_t x27;
    uint8_t x28;
    uint64_t x29;
    uint8_t x30;
    uint64_t x31;
    uint8_t x32;
    uint64_t x33;
    uint8_t x34;
    uint64_t x35;
    uint8_t x36;
    uint8_t x37;
    uint64_t x38;
    uint8_t x39;
    uint64_t x40;
    uint8_t x41;
    uint64_t x42;
    uint8_t x43;
    uint64_t x44;
    uint8_t x45;
    uint64_t x46;
    uint8_t x47;
    uint64_t x48;
    uint8_t x49;
    uint8_t x50;
    uint64_t x51;
    uint8_t x52;
    uint64_t x53;
    uint8_t x54;
    uint64_t x55;
    uint8_t x56;
    uint64_t x57;
    uint8_t x58;
    uint64_t x59;
    uint8_t x60;
    uint64_t x61;
    uint8_t x62;
    uint64_t x63;
    uint8_t x64;
    uint8_t x65;
    uint64_t x66;
    uint8_t x67;
    uint64_t x68;
    uint8_t x69;
    uint64_t x70;
    uint8_t x71;
    uint64_t x72;
    uint8_t x73;
    uint64_t x74;
    uint8_t x75;
    uint64_t x76;
    uint8_t x77;
    uint8_t x78;
    uint64_t x79;
    uint8_t x80;
    uint64_t x81;
    uint8_t x82;
    uint64_t x83;
    uint8_t x84;
    uint64_t x85;
    uint8_t x86;
    uint64_t x87;
    uint8_t x88;
    uint64_t x89;
    uint8_t x90;
    uint8_t x91;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_subborrowx_u52(
        &x1, &x2, 0x0, (arg1[0]), UINT64_C(0xffffffffffd97));
    fiat_id_tc26_gost_3410_2012_256_paramSetA_subborrowx_u51(
        &x3, &x4, x2, (arg1[1]), UINT64_C(0x7ffffffffffff));
    fiat_id_tc26_gost_3410_2012_256_paramSetA_subborrowx_u51(
        &x5, &x6, x4, (arg1[2]), UINT64_C(0x7ffffffffffff));
    fiat_id_tc26_gost_3410_2012_256_paramSetA_subborrowx_u51(
        &x7, &x8, x6, (arg1[3]), UINT64_C(0x7ffffffffffff));
    fiat_id_tc26_gost_3410_2012_256_paramSetA_subborrowx_u51(
        &x9, &x10, x8, (arg1[4]), UINT64_C(0x7ffffffffffff));
    fiat_id_tc26_gost_3410_2012_256_paramSetA_cmovznz_u64(
        &x11, x10, 0x0, UINT64_C(0xffffffffffffffff));
    fiat_id_tc26_gost_3410_2012_256_paramSetA_addcarryx_u52(
        &x12, &x13, 0x0, x1, (x11 & UINT64_C(0xffffffffffd97)));
    fiat_id_tc26_gost_3410_2012_256_paramSetA_addcarryx_u51(
        &x14, &x15, x13, x3, (x11 & UINT64_C(0x7ffffffffffff)));
    fiat_id_tc26_gost_3410_2012_256_paramSetA_addcarryx_u51(
        &x16, &x17, x15, x5, (x11 & UINT64_C(0x7ffffffffffff)));
    fiat_id_tc26_gost_3410_2012_256_paramSetA_addcarryx_u51(
        &x18, &x19, x17, x7, (x11 & UINT64_C(0x7ffffffffffff)));
    fiat_id_tc26_gost_3410_2012_256_paramSetA_addcarryx_u51(
        &x20, &x21, x19, x9, (x11 & UINT64_C(0x7ffffffffffff)));
    x22 = (x20 << 5);
    x23 = (x18 << 2);
    x24 = (x16 << 7);
    x25 = (x14 << 4);
    x26 = (uint8_t)(x12 & UINT8_C(0xff));
    x27 = (x12 >> 8);
    x28 = (uint8_t)(x27 & UINT8_C(0xff));
    x29 = (x27 >> 8);
    x30 = (uint8_t)(x29 & UINT8_C(0xff));
    x31 = (x29 >> 8);
    x32 = (uint8_t)(x31 & UINT8_C(0xff));
    x33 = (x31 >> 8);
    x34 = (uint8_t)(x33 & UINT8_C(0xff));
    x35 = (x33 >> 8);
    x36 = (uint8_t)(x35 & UINT8_C(0xff));
    x37 = (uint8_t)(x35 >> 8);
    x38 = (x25 + (uint64_t)x37);
    x39 = (uint8_t)(x38 & UINT8_C(0xff));
    x40 = (x38 >> 8);
    x41 = (uint8_t)(x40 & UINT8_C(0xff));
    x42 = (x40 >> 8);
    x43 = (uint8_t)(x42 & UINT8_C(0xff));
    x44 = (x42 >> 8);
    x45 = (uint8_t)(x44 & UINT8_C(0xff));
    x46 = (x44 >> 8);
    x47 = (uint8_t)(x46 & UINT8_C(0xff));
    x48 = (x46 >> 8);
    x49 = (uint8_t)(x48 & UINT8_C(0xff));
    x50 = (uint8_t)(x48 >> 8);
    x51 = (x24 + (uint64_t)x50);
    x52 = (uint8_t)(x51 & UINT8_C(0xff));
    x53 = (x51 >> 8);
    x54 = (uint8_t)(x53 & UINT8_C(0xff));
    x55 = (x53 >> 8);
    x56 = (uint8_t)(x55 & UINT8_C(0xff));
    x57 = (x55 >> 8);
    x58 = (uint8_t)(x57 & UINT8_C(0xff));
    x59 = (x57 >> 8);
    x60 = (uint8_t)(x59 & UINT8_C(0xff));
    x61 = (x59 >> 8);
    x62 = (uint8_t)(x61 & UINT8_C(0xff));
    x63 = (x61 >> 8);
    x64 = (uint8_t)(x63 & UINT8_C(0xff));
    x65 = (uint8_t)(x63 >> 8);
    x66 = (x23 + (uint64_t)x65);
    x67 = (uint8_t)(x66 & UINT8_C(0xff));
    x68 = (x66 >> 8);
    x69 = (uint8_t)(x68 & UINT8_C(0xff));
    x70 = (x68 >> 8);
    x71 = (uint8_t)(x70 & UINT8_C(0xff));
    x72 = (x70 >> 8);
    x73 = (uint8_t)(x72 & UINT8_C(0xff));
    x74 = (x72 >> 8);
    x75 = (uint8_t)(x74 & UINT8_C(0xff));
    x76 = (x74 >> 8);
    x77 = (uint8_t)(x76 & UINT8_C(0xff));
    x78 = (uint8_t)(x76 >> 8);
    x79 = (x22 + (uint64_t)x78);
    x80 = (uint8_t)(x79 & UINT8_C(0xff));
    x81 = (x79 >> 8);
    x82 = (uint8_t)(x81 & UINT8_C(0xff));
    x83 = (x81 >> 8);
    x84 = (uint8_t)(x83 & UINT8_C(0xff));
    x85 = (x83 >> 8);
    x86 = (uint8_t)(x85 & UINT8_C(0xff));
    x87 = (x85 >> 8);
    x88 = (uint8_t)(x87 & UINT8_C(0xff));
    x89 = (x87 >> 8);
    x90 = (uint8_t)(x89 & UINT8_C(0xff));
    x91 = (uint8_t)(x89 >> 8);
    out1[0] = x26;
    out1[1] = x28;
    out1[2] = x30;
    out1[3] = x32;
    out1[4] = x34;
    out1[5] = x36;
    out1[6] = x39;
    out1[7] = x41;
    out1[8] = x43;
    out1[9] = x45;
    out1[10] = x47;
    out1[11] = x49;
    out1[12] = x52;
    out1[13] = x54;
    out1[14] = x56;
    out1[15] = x58;
    out1[16] = x60;
    out1[17] = x62;
    out1[18] = x64;
    out1[19] = x67;
    out1[20] = x69;
    out1[21] = x71;
    out1[22] = x73;
    out1[23] = x75;
    out1[24] = x77;
    out1[25] = x80;
    out1[26] = x82;
    out1[27] = x84;
    out1[28] = x86;
    out1[29] = x88;
    out1[30] = x90;
    out1[31] = x91;
}